

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::ArrayBuilder<unsigned_char>::addAll<unsigned_char_const*,false>
          (ArrayBuilder<unsigned_char> *this,uchar *start,uchar *end)

{
  uchar *puVar1;
  
  puVar1 = this->pos;
  for (; start != end; start = start + 1) {
    *puVar1 = *start;
    puVar1 = puVar1 + 1;
  }
  this->pos = puVar1;
  return;
}

Assistant:

void ArrayBuilder<T>::addAll(Iterator start, Iterator end) {
  pos = _::CopyConstructArray_<RemoveConst<T>, Decay<Iterator>, move>::apply(pos, start, end);
}